

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCut.c
# Opt level: O0

uint Dar_CutTruthStretch(uint uTruth,int nVars,uint Phase)

{
  int local_20;
  int local_1c;
  int Var;
  int k;
  int i;
  uint Phase_local;
  int nVars_local;
  uint uTruth_local;
  
  local_20 = nVars + -1;
  Phase_local = uTruth;
  for (Var = 3; -1 < Var; Var = Var + -1) {
    if ((Phase & 1 << ((byte)Var & 0x1f)) != 0) {
      for (local_1c = local_20; local_1c < Var; local_1c = local_1c + 1) {
        Phase_local = Dar_CutTruthSwapAdjacentVars(Phase_local,local_1c);
      }
      local_20 = local_20 + -1;
    }
  }
  if (local_20 == -1) {
    return Phase_local;
  }
  __assert_fail("Var == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darCut.c"
                ,0x1e0,"unsigned int Dar_CutTruthStretch(unsigned int, int, unsigned int)");
}

Assistant:

static inline unsigned Dar_CutTruthStretch( unsigned uTruth, int nVars, unsigned Phase )
{
    int i, k, Var = nVars - 1;
    for ( i = 3; i >= 0; i-- )
        if ( Phase & (1 << i) )
        {
            for ( k = Var; k < i; k++ )
                uTruth = Dar_CutTruthSwapAdjacentVars( uTruth, k );
            Var--;
        }
    assert( Var == -1 );
    return uTruth;
}